

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascDecrypt.cpp
# Opt level: O0

int CascDecrypt(TCascStorage *hs,LPBYTE pbOutBuffer,PDWORD pcbOutBuffer,LPBYTE pbInBuffer,
               DWORD cbInBuffer,DWORD dwFrameIndex)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  LPBYTE pbKey_00;
  ulong local_78;
  size_t i;
  int nError;
  BYTE EncryptionType;
  BYTE Vector [8];
  DWORD IVSize;
  DWORD dwShift;
  DWORD KeyNameSize;
  LPBYTE pbKey;
  LPBYTE pbBufferEnd;
  ULONGLONG KeyName;
  DWORD dwFrameIndex_local;
  DWORD cbInBuffer_local;
  LPBYTE pbInBuffer_local;
  PDWORD pcbOutBuffer_local;
  LPBYTE pbOutBuffer_local;
  TCascStorage *hs_local;
  
  pbBufferEnd = (LPBYTE)0x0;
  pbVar3 = pbInBuffer + cbInBuffer;
  Vector[4] = '\0';
  Vector[5] = '\0';
  Vector[6] = '\0';
  Vector[7] = '\0';
  if (pbInBuffer < pbVar3) {
    if ((*pbInBuffer == '\0') || (*pbInBuffer == '\b')) {
      _dwFrameIndex_local = pbInBuffer + 1;
      uVar2 = (uint)*pbInBuffer;
      if (_dwFrameIndex_local + uVar2 < pbVar3) {
        KeyName._0_4_ = dwFrameIndex;
        KeyName._4_4_ = cbInBuffer;
        pbInBuffer_local = (LPBYTE)pcbOutBuffer;
        pcbOutBuffer_local = (PDWORD)pbOutBuffer;
        pbOutBuffer_local = (LPBYTE)hs;
        memcpy(&pbBufferEnd,_dwFrameIndex_local,(ulong)uVar2);
        pbVar4 = _dwFrameIndex_local + uVar2;
        if (pbVar4 < pbVar3) {
          if ((*pbVar4 == 4) || (*pbVar4 == 8)) {
            _dwFrameIndex_local = pbVar4 + 1;
            Vector._0_4_ = ZEXT14(*pbVar4);
            if (_dwFrameIndex_local + (uint)Vector._0_4_ < pbVar3) {
              memset(&nError,0,8);
              memcpy(&nError,_dwFrameIndex_local,(ulong)(uint)Vector._0_4_);
              pbVar4 = _dwFrameIndex_local + (uint)Vector._0_4_;
              if (pbVar4 < pbVar3) {
                if ((*pbVar4 == 0x53) || (*pbVar4 == 0x41)) {
                  _dwFrameIndex_local = pbVar4 + 1;
                  bVar1 = *pbVar4;
                  if (*(uint *)pbInBuffer_local < (uint)((int)pbVar3 - (int)_dwFrameIndex_local)) {
                    hs_local._4_4_ = 0x69;
                  }
                  else {
                    pbKey_00 = CascFindKey((TCascStorage *)pbOutBuffer_local,(ULONGLONG)pbBufferEnd)
                    ;
                    if (pbKey_00 == (LPBYTE)0x0) {
                      hs_local._4_4_ = 0x3ed;
                    }
                    else {
                      for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
                        *(byte *)((long)&nError + local_78) =
                             *(byte *)((long)&nError + local_78) ^
                             (byte)((DWORD)KeyName >> ((byte)Vector._4_4_ & 0x1f));
                        Vector._4_4_ = Vector._4_4_ + 8;
                      }
                      if (bVar1 != 0x53) {
                        __assert_fail("false",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascDecrypt.cpp"
                                      ,0x1a9,
                                      "int CascDecrypt(TCascStorage *, LPBYTE, PDWORD, LPBYTE, DWORD, DWORD)"
                                     );
                      }
                      hs_local._4_4_ =
                           Decrypt_Salsa20((LPBYTE)pcbOutBuffer_local,_dwFrameIndex_local,
                                           (long)pbVar3 - (long)_dwFrameIndex_local,pbKey_00,0x10,
                                           (LPBYTE)&nError);
                      if (hs_local._4_4_ == 0) {
                        *(int *)pbInBuffer_local = (int)pbVar3 - (int)_dwFrameIndex_local;
                        hs_local._4_4_ = 0;
                      }
                    }
                  }
                }
                else {
                  hs_local._4_4_ = 0x5f;
                }
              }
              else {
                hs_local._4_4_ = 0x3ec;
              }
            }
            else {
              hs_local._4_4_ = 0x3ec;
            }
          }
          else {
            hs_local._4_4_ = 0x5f;
          }
        }
        else {
          hs_local._4_4_ = 0x3ec;
        }
      }
      else {
        hs_local._4_4_ = 0x3ec;
      }
    }
    else {
      hs_local._4_4_ = 0x5f;
    }
  }
  else {
    hs_local._4_4_ = 0x3ec;
  }
  return hs_local._4_4_;
}

Assistant:

int CascDecrypt(TCascStorage * hs, LPBYTE pbOutBuffer, PDWORD pcbOutBuffer, LPBYTE pbInBuffer, DWORD cbInBuffer, DWORD dwFrameIndex)
{
    ULONGLONG KeyName = 0;
    LPBYTE pbBufferEnd = pbInBuffer + cbInBuffer;
    LPBYTE pbKey;
    DWORD KeyNameSize;
    DWORD dwShift = 0;
    DWORD IVSize;
    BYTE Vector[0x08];
    BYTE EncryptionType;
    int nError;

    // Verify and retrieve the key name size
    if(pbInBuffer >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    if(pbInBuffer[0] != 0 && pbInBuffer[0] != 8)
        return ERROR_NOT_SUPPORTED;
    KeyNameSize = *pbInBuffer++;

    // Copy the key name
    if((pbInBuffer + KeyNameSize) >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    memcpy(&KeyName, pbInBuffer, KeyNameSize);
    pbInBuffer += KeyNameSize;

    // Verify and retrieve the Vector size
    if(pbInBuffer >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    if(pbInBuffer[0] != 4 && pbInBuffer[0] != 8)
        return ERROR_NOT_SUPPORTED;
    IVSize = *pbInBuffer++;

    // Copy the initialization vector
    if((pbInBuffer + IVSize) >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    memset(Vector, 0, sizeof(Vector));
    memcpy(Vector, pbInBuffer, IVSize);
    pbInBuffer += IVSize;

    // Verify and retrieve the encryption type
    if(pbInBuffer >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    if(pbInBuffer[0] != 'S' && pbInBuffer[0] != 'A')
        return ERROR_NOT_SUPPORTED;
    EncryptionType = *pbInBuffer++;

    // Do we have enough space in the output buffer?
    if((DWORD)(pbBufferEnd - pbInBuffer) > pcbOutBuffer[0])
        return ERROR_INSUFFICIENT_BUFFER;

    // Check if we know the key
    pbKey = CascFindKey(hs, KeyName);
    if(pbKey == NULL)
        return ERROR_FILE_ENCRYPTED;

    // Shuffle the Vector with the block index
    // Note that there's no point to go beyond 32 bits, unless the file has
    // more than 0xFFFFFFFF frames.
    for(size_t i = 0; i < sizeof(dwFrameIndex); i++)
    {
        Vector[i] = Vector[i] ^ (BYTE)((dwFrameIndex >> dwShift) & 0xFF);
        dwShift += 8;
    }

    // Perform the decryption-specific action
    switch(EncryptionType)
    {
        case 'S':   // Salsa20
            nError = Decrypt_Salsa20(pbOutBuffer, pbInBuffer, (pbBufferEnd - pbInBuffer), pbKey, 0x10, Vector);
            if(nError != ERROR_SUCCESS)
                return nError;

            // Supply the size of the output buffer
            pcbOutBuffer[0] = (DWORD)(pbBufferEnd - pbInBuffer);
            return ERROR_SUCCESS;

//      case 'A':   
//          return ERROR_NOT_SUPPORTED;
    }

    assert(false);
    return ERROR_NOT_SUPPORTED;
}